

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_lu.cc
# Opt level: O3

X509_LOOKUP * X509_STORE_add_lookup(X509_STORE *v,X509_LOOKUP_METHOD *m)

{
  OPENSSL_STACK *sk;
  code *pcVar1;
  int iVar2;
  size_t sVar3;
  X509_LOOKUP *pXVar4;
  size_t sVar5;
  
  sk = (OPENSSL_STACK *)v->check_revocation;
  sVar3 = OPENSSL_sk_num(sk);
  if (sVar3 != 0) {
    sVar3 = 0;
    do {
      pXVar4 = (X509_LOOKUP *)OPENSSL_sk_value(sk,sVar3);
      if (*(X509_LOOKUP_METHOD **)pXVar4 == m) {
        return pXVar4;
      }
      sVar3 = sVar3 + 1;
      sVar5 = OPENSSL_sk_num(sk);
    } while (sVar3 < sVar5);
  }
  pXVar4 = (X509_LOOKUP *)OPENSSL_zalloc(0x18);
  if (pXVar4 != (X509_LOOKUP *)0x0) {
    *(X509_LOOKUP_METHOD **)pXVar4 = m;
    pXVar4->method_data = (char *)v;
    if (((code *)m->name == (code *)0x0) || (iVar2 = (*(code *)m->name)(pXVar4), iVar2 != 0)) {
      sVar3 = OPENSSL_sk_push((OPENSSL_STACK *)v->check_revocation,pXVar4);
      if (sVar3 != 0) {
        return pXVar4;
      }
      if ((*(long *)pXVar4 != 0) &&
         (pcVar1 = *(code **)(*(long *)pXVar4 + 8), pcVar1 != (code *)0x0)) {
        (*pcVar1)(pXVar4);
      }
    }
    OPENSSL_free(pXVar4);
  }
  return (X509_LOOKUP *)0x0;
}

Assistant:

X509_LOOKUP *X509_STORE_add_lookup(X509_STORE *v, const X509_LOOKUP_METHOD *m) {
  STACK_OF(X509_LOOKUP) *sk = v->get_cert_methods;
  for (size_t i = 0; i < sk_X509_LOOKUP_num(sk); i++) {
    X509_LOOKUP *lu = sk_X509_LOOKUP_value(sk, i);
    if (m == lu->method) {
      return lu;
    }
  }

  X509_LOOKUP *lu = X509_LOOKUP_new(m, v);
  if (lu == NULL || !sk_X509_LOOKUP_push(v->get_cert_methods, lu)) {
    X509_LOOKUP_free(lu);
    return NULL;
  }

  return lu;
}